

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O1

void xm_envelope_tick(xm_channel_context_t *ch,xm_envelope_t *env,uint16_t *counter,float *outval)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ulong uVar5;
  float fVar6;
  
  bVar1 = env->num_points;
  if (bVar1 < 2) {
    if (bVar1 != 1) {
      return;
    }
    fVar6 = (float)env->points[0].value * 0.015625;
    *outval = fVar6;
    if (fVar6 <= 1.0) {
      return;
    }
    *outval = 1.0;
    return;
  }
  if (env->loop_enabled == true) {
    uVar2 = env->points[env->loop_end_point].frame;
    if (uVar2 <= *counter) {
      *counter = (*counter - uVar2) + env->points[env->loop_start_point].frame;
    }
  }
  if (bVar1 == 2) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    do {
      if ((env->points[uVar5].frame <= *counter) && (*counter <= env->points[uVar5 + 1].frame))
      break;
      uVar5 = uVar5 + 1;
    } while ((int)((uint)uVar5 & 0xff) < (int)(bVar1 - 2));
    uVar5 = uVar5 & 0xff;
  }
  uVar2 = *counter;
  uVar3 = env->points[uVar5].frame;
  if (uVar3 < uVar2) {
    uVar4 = env->points[uVar5 + 1].frame;
    if (uVar2 < uVar4) {
      fVar6 = (float)(int)((uint)uVar2 - (uint)uVar3) / (float)(int)((uint)uVar4 - (uint)uVar3);
      fVar6 = (float)env->points[uVar5 + 1].value * fVar6 +
              (1.0 - fVar6) * (float)env->points[uVar5].value;
      goto LAB_00106044;
    }
    uVar3 = env->points[uVar5 + 1].value;
  }
  else {
    uVar3 = env->points[uVar5].value;
  }
  fVar6 = (float)uVar3;
LAB_00106044:
  *outval = fVar6 * 0.015625;
  if (((ch->sustained != true) || (env->sustain_enabled != true)) ||
     (uVar2 != env->points[env->sustain_point].frame)) {
    *counter = uVar2 + 1;
  }
  return;
}

Assistant:

static void xm_envelope_tick(xm_channel_context_t* ch,
							 xm_envelope_t* env,
							 uint16_t* counter,
							 float* outval) {
	if(env->num_points < 2) {
		/* Don't really know what to do… */
		if(env->num_points == 1) {
			/* XXX I am pulling this out of my ass */
			*outval = (float)env->points[0].value / (float)0x40;
			if(*outval > 1) {
				*outval = 1;
			}
		}

		return;
	} else {
		uint8_t j;

		if(env->loop_enabled) {
			uint16_t loop_start = env->points[env->loop_start_point].frame;
			uint16_t loop_end = env->points[env->loop_end_point].frame;
			uint16_t loop_length = loop_end - loop_start;

			if(*counter >= loop_end) {
				*counter -= loop_length;
			}
		}

		for(j = 0; j < (env->num_points - 2); ++j) {
			if(env->points[j].frame <= *counter &&
			   env->points[j+1].frame >= *counter) {
				break;
			}
		}

		*outval = xm_envelope_lerp(env->points + j, env->points + j + 1, *counter) / (float)0x40;

		/* Make sure it is safe to increment frame count */
		if(!ch->sustained || !env->sustain_enabled ||
		   *counter != env->points[env->sustain_point].frame) {
			(*counter)++;
		}
	}
}